

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O3

bool Args::details::argNameLess<Args::ArgIface*>(ArgIface **a1,ArgIface **a2)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar3;
  bool bVar4;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  (*(*a1)->_vptr_ArgIface[3])(&local_70);
  if (local_68 == 0) {
    bVar4 = false;
  }
  else {
    (*(*a2)->_vptr_ArgIface[3])(&local_50);
    bVar4 = local_48 != 0;
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (bVar4) {
    (*(*a1)->_vptr_ArgIface[3])(&local_70);
    if ((char)*local_70 == '-') {
      bVar4 = false;
    }
    else {
      (*(*a2)->_vptr_ArgIface[3])(&local_50);
      bVar4 = (char)*local_50 == '-';
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (bVar4) {
      return true;
    }
    (*(*a1)->_vptr_ArgIface[3])(&local_70);
    if ((char)*local_70 == '-') {
      (*(*a2)->_vptr_ArgIface[3])(&local_50);
      bVar4 = (char)*local_50 != '-';
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    else {
      bVar4 = false;
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (bVar4) {
      return false;
    }
    iVar2 = (*(*a1)->_vptr_ArgIface[8])();
    if ((*(long *)(CONCAT44(extraout_var,iVar2) + 8) == 0) &&
       (iVar2 = (*(*a2)->_vptr_ArgIface[8])(), *(long *)(CONCAT44(extraout_var_02,iVar2) + 8) != 0))
    {
      return true;
    }
    iVar2 = (*(*a1)->_vptr_ArgIface[8])();
    if ((*(long *)(CONCAT44(extraout_var_00,iVar2) + 8) != 0) &&
       (iVar2 = (*(*a2)->_vptr_ArgIface[8])(), *(long *)(CONCAT44(extraout_var_01,iVar2) + 8) == 0))
    {
      return false;
    }
    (*(*a1)->_vptr_ArgIface[3])(&local_70);
    (*(*a2)->_vptr_ArgIface[3])(&local_50);
  }
  else {
    (*(*a1)->_vptr_ArgIface[3])(&local_70);
    (*(*a2)->_vptr_ArgIface[3])(&local_50);
  }
  uVar3 = local_68;
  if (local_48 < local_68) {
    uVar3 = local_48;
  }
  if (uVar3 != 0) {
    uVar1 = memcmp(local_70,local_50,uVar3);
    uVar3 = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_0010c151;
  }
  uVar3 = 0xffffffff80000000;
  if (-0x80000000 < (long)(local_68 - local_48)) {
    uVar3 = local_68 - local_48;
  }
  if (0x7ffffffe < (long)uVar3) {
    uVar3 = 0;
  }
LAB_0010c151:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return (bool)((byte)(uVar3 >> 0x1f) & 1);
}

Assistant:

bool argNameLess( const T & a1, const T & a2 )
{
	static const Char dash = SL( '-' );

	if( !a1->name().empty() && !a2->name().empty() )
	{
		if( *( a1->name().cbegin() ) != dash &&
				*( a2->name().cbegin() ) == dash )
			return true;
		else if( *( a1->name().cbegin() ) == dash &&
				*( a2->name().cbegin() ) != dash )
			return false;
		else if( a1->argumentName().empty() && !a2->argumentName().empty() )
			return true;
		else if( !a1->argumentName().empty() && a2->argumentName().empty() )
			return false;
		else
			return ( a1->name() < a2->name() );
	}
	else
		return ( a1->name() < a2->name() );
}